

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O3

void SDL_GL_Lock(void)

{
  int iVar1;
  bool bVar2;
  
  if ((OpenGLBlitTexture != 0) &&
     (iVar1 = OpenGLBlitLockCount + 1, bVar2 = OpenGLBlitLockCount == 0, OpenGLBlitLockCount = iVar1
     , bVar2)) {
    (*OpenGLFuncs.glPushAttrib)(0xfffff);
    (*OpenGLFuncs.glPushClientAttrib)(1);
    (*OpenGLFuncs.glEnable)(0xde1);
    (*OpenGLFuncs.glEnable)(0xbe2);
    (*OpenGLFuncs.glDisable)(0xb60);
    (*OpenGLFuncs.glDisable)(0xbc0);
    (*OpenGLFuncs.glDisable)(0xb71);
    (*OpenGLFuncs.glDisable)(0xc11);
    (*OpenGLFuncs.glDisable)(0xb90);
    (*OpenGLFuncs.glDisable)(0xb44);
    (*OpenGLFuncs.glBindTexture)(0xde1,OpenGLBlitTexture);
    (*OpenGLFuncs.glTexEnvf)(0x2300,0x2200,8448.0);
    (*OpenGLFuncs.glTexParameteri)(0xde1,0x2801,0x2600);
    (*OpenGLFuncs.glTexParameteri)(0xde1,0x2800,0x2600);
    (*OpenGLFuncs.glTexParameteri)(0xde1,0x2802,0x2901);
    (*OpenGLFuncs.glTexParameteri)(0xde1,0x2803,0x2901);
    (*OpenGLFuncs.glPixelStorei)
              (0xcf2,(uint)VideoSurface12Location.pitch /
                     (uint)(VideoSurface12Location.format)->BytesPerPixel);
    (*OpenGLFuncs.glBlendFunc)(0x302,0x303);
    (*OpenGLFuncs.glColor4f)(1.0,1.0,1.0,1.0);
    (*OpenGLFuncs.glViewport)(0,0,VideoSurface12Location.w,VideoSurface12Location.h);
    (*OpenGLFuncs.glMatrixMode)(0x1701);
    (*OpenGLFuncs.glPushMatrix)();
    (*OpenGLFuncs.glLoadIdentity)();
    (*OpenGLFuncs.glOrtho)
              (0.0,(double)VideoSurface12Location.w,(double)VideoSurface12Location.h,0.0,0.0,1.0);
    (*OpenGLFuncs.glMatrixMode)(0x1700);
    (*OpenGLFuncs.glPushMatrix)();
    (*OpenGLFuncs.glLoadIdentity)();
    return;
  }
  return;
}

Assistant:

SDLCALL
SDL_GL_Lock(void)
{
    if (!OpenGLBlitTexture) {
        return;
    }

    if (++OpenGLBlitLockCount == 1) {
        OpenGLFuncs.glPushAttrib(GL_ALL_ATTRIB_BITS);
        OpenGLFuncs.glPushClientAttrib(GL_CLIENT_PIXEL_STORE_BIT);
        OpenGLFuncs.glEnable(GL_TEXTURE_2D);
        OpenGLFuncs.glEnable(GL_BLEND);
        OpenGLFuncs.glDisable(GL_FOG);
        OpenGLFuncs.glDisable(GL_ALPHA_TEST);
        OpenGLFuncs.glDisable(GL_DEPTH_TEST);
        OpenGLFuncs.glDisable(GL_SCISSOR_TEST);
        OpenGLFuncs.glDisable(GL_STENCIL_TEST);
        OpenGLFuncs.glDisable(GL_CULL_FACE);

        OpenGLFuncs.glBindTexture(GL_TEXTURE_2D, OpenGLBlitTexture);
        OpenGLFuncs.glTexEnvf(GL_TEXTURE_ENV, GL_TEXTURE_ENV_MODE, GL_MODULATE);
        OpenGLFuncs.glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
        OpenGLFuncs.glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
        OpenGLFuncs.glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_REPEAT);
        OpenGLFuncs.glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_REPEAT);

        OpenGLFuncs.glPixelStorei(GL_UNPACK_ROW_LENGTH, VideoSurface12->pitch / VideoSurface12->format->BytesPerPixel);
        OpenGLFuncs.glBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
        OpenGLFuncs.glColor4f(1.0f, 1.0f, 1.0f, 1.0f);

        OpenGLFuncs.glViewport(0, 0, VideoSurface12->w, VideoSurface12->h);
        OpenGLFuncs.glMatrixMode(GL_PROJECTION);
        OpenGLFuncs.glPushMatrix();
        OpenGLFuncs.glLoadIdentity();

        OpenGLFuncs.glOrtho(0.0, (GLdouble) VideoSurface12->w, (GLdouble) VideoSurface12->h, 0.0, 0.0, 1.0);

        OpenGLFuncs.glMatrixMode(GL_MODELVIEW);
        OpenGLFuncs.glPushMatrix();
        OpenGLFuncs.glLoadIdentity();
    }
}